

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

void __thiscall
kj::ArrayBuilder<capnp::InterfaceSchema::Method>::~ArrayBuilder
          (ArrayBuilder<capnp::InterfaceSchema::Method> *this)

{
  Method *pMVar1;
  RemoveConst<capnp::InterfaceSchema::Method> *pRVar2;
  Method *pMVar3;
  
  pMVar1 = this->ptr;
  if (pMVar1 != (Method *)0x0) {
    pRVar2 = this->pos;
    pMVar3 = this->endPtr;
    this->ptr = (Method *)0x0;
    this->pos = (RemoveConst<capnp::InterfaceSchema::Method> *)0x0;
    this->endPtr = (Method *)0x0;
    (**this->disposer->_vptr_ArrayDisposer)
              (this->disposer,pMVar1,0x40,(long)pRVar2 - (long)pMVar1 >> 6,
               (long)pMVar3 - (long)pMVar1 >> 6,0);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }